

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O0

double __thiscall ON_Light::HotSpot(ON_Light *this)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double local_30;
  double cos_ha;
  double a;
  double x;
  double h;
  ON_Light *this_local;
  
  x = this->m_hotspot;
  if ((x < 0.0) || (1.0 < x)) {
    if (this->m_spot_exponent < 65536.0) {
      if (((this->m_spot_exponent <= 0.0) || (this->m_spot_angle <= 0.0)) ||
         (90.0 < this->m_spot_angle)) {
        x = 1.0;
      }
      else {
        dVar2 = log_hotspot_min / this->m_spot_exponent;
        if (-690.0 <= dVar2) {
          local_30 = exp(dVar2);
          bVar1 = ON_IsValid(local_30);
          if (bVar1) {
            if (local_30 <= 1.0) {
              if (local_30 < -1.0) {
                local_30 = -1.0;
              }
            }
            else {
              local_30 = 1.0;
            }
          }
          else {
            local_30 = 0.0;
          }
          dVar2 = SpotAngleRadians(this);
          dVar3 = acos(local_30);
          x = dVar3 / dVar2;
          if (0.0 <= x) {
            if (1.0 < x) {
              x = 1.0;
            }
          }
          else {
            x = 0.0;
          }
        }
        else {
          x = 1.0;
        }
      }
    }
    else {
      x = 0.0;
    }
  }
  return x;
}

Assistant:

double ON_Light::HotSpot() const
{
  double h = m_hotspot;
  if ( h < 0.0 || h > 1.0 ) {
    // spotlight is using spot exponent interface
    if ( m_spot_exponent >= 65536.0 )
      h = 0.0;
    else if ( m_spot_exponent <= 0.0 || m_spot_angle <= 0.0 || m_spot_angle > 90.0 )
      h = 1.0;
    else {
      // compute HotSpot() from cos(h*angle)^e = hotspot_min
      double x, a, cos_ha;
      x = log_hotspot_min/m_spot_exponent; // note that x < 0.0
      if ( x < -690.0 ) {
        // prevent underflow.  cos_ha is close to zero so
        h = 1.0;
      }
      else 
      {
        cos_ha = exp(x);
        if (!ON_IsValid(cos_ha))  cos_ha =  0.0;
        else if ( cos_ha >  1.0 ) cos_ha =  1.0;
        else if ( cos_ha < -1.0 ) cos_ha = -1.0;
        a = SpotAngleRadians();
        h = acos(cos_ha)/a;
        if ( h < 0.0 )
          h = 0.0;
        else if ( h > 1.0 ) {
          // happens for smaller e
          h = 1.0;
        }
      }
    }
  }
  return h;
}